

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

void stb__sha1(stb_uchar *chunk,stb_uint *h)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  stb_uint sVar4;
  stb_uint sVar5;
  stb_uint sVar6;
  uint uVar7;
  stb_uint sVar8;
  int iVar9;
  uint auStack_1b8 [8];
  uint auStack_198 [5];
  uint auStack_184 [85];
  
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    uVar3 = *(uint *)(chunk + lVar2 * 4);
    auStack_184[lVar2 + 3] =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  }
  for (lVar2 = 0x10; lVar2 != 0x50; lVar2 = lVar2 + 1) {
    uVar3 = auStack_198[lVar2] ^ auStack_184[lVar2] ^ auStack_1b8[lVar2 + 2] ^ auStack_1b8[lVar2];
    auStack_184[lVar2 + 3] = uVar3 << 1 | (uint)((int)uVar3 < 0);
  }
  sVar8 = h[4];
  sVar4 = h[3];
  sVar5 = h[2];
  sVar6 = h[1];
  uVar3 = *h;
  for (lVar2 = 0; lVar2 != 0x14; lVar2 = lVar2 + 1) {
    uVar7 = (sVar5 ^ sVar4) & sVar6 ^ sVar4;
    lVar1 = lVar2 + 3;
    iVar9 = sVar8 + (uVar3 << 5 | uVar3 >> 0x1b);
    sVar8 = sVar4;
    sVar4 = sVar5;
    sVar5 = sVar6 << 0x1e | sVar6 >> 2;
    sVar6 = uVar3;
    uVar3 = iVar9 + uVar7 + auStack_184[lVar1] + 0x5a827999;
  }
  for (lVar2 = 0x14; lVar2 != 0x28; lVar2 = lVar2 + 1) {
    lVar1 = lVar2 + 3;
    iVar9 = sVar8 + (sVar5 ^ sVar4 ^ sVar6);
    sVar8 = sVar4;
    sVar4 = sVar5;
    sVar5 = sVar6 << 0x1e | sVar6 >> 2;
    sVar6 = uVar3;
    uVar3 = iVar9 + (uVar3 << 5 | uVar3 >> 0x1b) + auStack_184[lVar1] + 0x6ed9eba1;
  }
  for (lVar2 = 0x28; lVar2 != 0x3c; lVar2 = lVar2 + 1) {
    uVar7 = (sVar6 ^ sVar5) & sVar4;
    lVar1 = lVar2 + 3;
    iVar9 = sVar8 + (sVar6 & sVar5);
    sVar8 = sVar4;
    sVar4 = sVar5;
    sVar5 = sVar6 << 0x1e | sVar6 >> 2;
    sVar6 = uVar3;
    uVar3 = auStack_184[lVar1] + iVar9 + uVar7 + (uVar3 << 5 | uVar3 >> 0x1b) + 0x8f1bbcdc;
  }
  for (lVar2 = 0x3c; lVar2 != 0x50; lVar2 = lVar2 + 1) {
    lVar1 = lVar2 + 3;
    iVar9 = sVar8 + (sVar5 ^ sVar4 ^ sVar6);
    sVar8 = sVar4;
    sVar4 = sVar5;
    sVar5 = sVar6 << 0x1e | sVar6 >> 2;
    sVar6 = uVar3;
    uVar3 = auStack_184[lVar1] + iVar9 + (uVar3 << 5 | uVar3 >> 0x1b) + 0xca62c1d6;
  }
  *h = uVar3 + *h;
  h[1] = sVar6 + h[1];
  h[2] = sVar5 + h[2];
  h[3] = sVar4 + h[3];
  h[4] = sVar8 + h[4];
  return;
}

Assistant:

static void stb__sha1(stb_uchar *chunk, stb_uint h[5])
{
   int i;
   stb_uint a,b,c,d,e;
   stb_uint w[80];

   for (i=0; i < 16; ++i)
      w[i] = stb_big32(&chunk[i*4]);
   for (i=16; i < 80; ++i) {
      stb_uint t;
      t = w[i-3] ^ w[i-8] ^ w[i-14] ^ w[i-16];
      w[i] = (t + t) | (t >> 31);
   }

   a = h[0];
   b = h[1];
   c = h[2];
   d = h[3];
   e = h[4];

   #define STB__SHA1(k,f)                                            \
   {                                                                 \
      stb_uint temp = (a << 5) + (a >> 27) + (f) + e + (k) + w[i];  \
      e = d;                                                       \
      d = c;                                                     \
      c = (b << 30) + (b >> 2);                               \
      b = a;                                              \
      a = temp;                                    \
   }

   i=0;
   for (; i < 20; ++i) STB__SHA1(0x5a827999, d ^ (b & (c ^ d))       );
   for (; i < 40; ++i) STB__SHA1(0x6ed9eba1, b ^ c ^ d               );
   for (; i < 60; ++i) STB__SHA1(0x8f1bbcdc, (b & c) + (d & (b ^ c)) );
   for (; i < 80; ++i) STB__SHA1(0xca62c1d6, b ^ c ^ d               );

   #undef STB__SHA1

   h[0] += a;
   h[1] += b;
   h[2] += c;
   h[3] += d;
   h[4] += e;
}